

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_container_index_equalorlarger(array_container_t *arr,uint16_t x)

{
  int32_t lenarray;
  uint uVar1;
  uint uVar2;
  
  lenarray = arr->cardinality;
  uVar1 = binarySearch(arr->array,lenarray,x);
  uVar2 = 0xffffffff;
  if ((int)~uVar1 < lenarray) {
    uVar2 = ~uVar1;
  }
  if ((int)uVar1 < 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

inline int array_container_index_equalorlarger(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        int32_t candidate = - idx - 1;
        if(candidate < arr->cardinality) return candidate;
        return -1;
    }
}